

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RandSequenceStatementSyntax::setChild
          (RandSequenceStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  NamedLabelSyntax *pNVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar3;
  SyntaxNode *pSVar4;
  SyntaxList<slang::syntax::ProductionSyntax> *pSVar5;
  logic_error *this_00;
  Token TVar6;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 8) {
    switch(index) {
    case 0:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        pNVar2 = (NamedLabelSyntax *)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        pNVar2 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar4);
      }
      (this->super_StatementSyntax).label = pNVar2;
      break;
    case 1:
      pSVar4 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar4);
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar3->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 2:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->randsequence).kind = TVar6.kind;
      (this->randsequence).field_0x2 = TVar6._2_1_;
      (this->randsequence).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->randsequence).rawLen = TVar6.rawLen;
      (this->randsequence).info = TVar6.info;
      break;
    case 3:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openParen).kind = TVar6.kind;
      (this->openParen).field_0x2 = TVar6._2_1_;
      (this->openParen).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->openParen).rawLen = TVar6.rawLen;
      (this->openParen).info = TVar6.info;
      break;
    case 4:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->firstProduction).kind = TVar6.kind;
      (this->firstProduction).field_0x2 = TVar6._2_1_;
      (this->firstProduction).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->firstProduction).rawLen = TVar6.rawLen;
      (this->firstProduction).info = TVar6.info;
      break;
    case 5:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeParen).kind = TVar6.kind;
      (this->closeParen).field_0x2 = TVar6._2_1_;
      (this->closeParen).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->closeParen).rawLen = TVar6.rawLen;
      (this->closeParen).info = TVar6.info;
      break;
    case 6:
      pSVar4 = TokenOrSyntax::node(&child);
      pSVar5 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>>(pSVar4);
      (this->productions).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->productions).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->productions).super_SyntaxListBase.childCount =
           (pSVar5->super_SyntaxListBase).childCount;
      sVar1 = (pSVar5->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).size_;
      (this->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.
      data_ = (pSVar5->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).data_;
      (this->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.
      size_ = sVar1;
      break;
    case 7:
      TVar6 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endsequence).kind = TVar6.kind;
      (this->endsequence).field_0x2 = TVar6._2_1_;
      (this->endsequence).numFlags = (NumericTokenFlags)TVar6.numFlags.raw;
      (this->endsequence).rawLen = TVar6.rawLen;
      (this->endsequence).info = TVar6.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x2add);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void RandSequenceStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: randsequence = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: firstProduction = child.token(); return;
        case 5: closeParen = child.token(); return;
        case 6: productions = child.node()->as<SyntaxList<ProductionSyntax>>(); return;
        case 7: endsequence = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}